

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O1

void __thiscall
ON_PolynomialCurve::ON_PolynomialCurve(ON_PolynomialCurve *this,ON_PolynomialCurve *src)

{
  double dVar1;
  
  this->m_dim = 0;
  this->m_is_rat = 0;
  this->m_order = 0;
  ON_4dPointArray::ON_4dPointArray(&this->m_cv);
  ON_Interval::ON_Interval(&this->m_domain,0.0,1.0);
  if (this != src) {
    this->m_dim = src->m_dim;
    this->m_is_rat = src->m_is_rat;
    this->m_order = src->m_order;
    ON_4dPointArray::operator=(&this->m_cv,&src->m_cv);
    dVar1 = (src->m_domain).m_t[1];
    (this->m_domain).m_t[0] = (src->m_domain).m_t[0];
    (this->m_domain).m_t[1] = dVar1;
  }
  return;
}

Assistant:

ON_PolynomialCurve::ON_PolynomialCurve(const ON_PolynomialCurve& src)
                   : m_dim(0), m_is_rat(0), m_order(0), m_domain(0.0,1.0)
{
  *this = src;
}